

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O0

nhr_bool nhr_request_recv(nhr_request_conflict r)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  time_t tVar5;
  nhr_response pnVar6;
  undefined1 auStack_10028 [8];
  char buff [65536];
  int len;
  int error_number;
  nhr_request_conflict r_local;
  
  do {
    sVar3 = recv(r->socket,auStack_10028,0x10000,0);
    iVar2 = (int)sVar3;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    if (0 < iVar2) {
      tVar5 = time((time_t *)0x0);
      r->last_time = tVar5;
      if (r->response == (nhr_response)0x0) {
        pnVar6 = nhr_response_create(auStack_10028,(long)iVar2);
        r->response = pnVar6;
      }
      else {
        nhr_response_append(r->response,auStack_10028,(long)iVar2);
      }
    }
  } while (0 < iVar2);
  if ((iVar1 == 0xb) || (iVar1 == 0x73)) {
    r_local._7_1_ = '\x01';
  }
  else {
    nhr_request_close(r);
    r_local._7_1_ = '\0';
  }
  return r_local._7_1_;
}

Assistant:

nhr_bool nhr_request_recv(nhr_request r) {
	int error_number = -1, len = -1;
	char buff[NHR_RECV_BUFF_SIZE];

	do {
		len = (int)recv(r->socket, buff, NHR_RECV_BUFF_SIZE, 0);
#if defined(NHR_OS_WINDOWS)
		error_number = WSAGetLastError();
#else
		error_number = errno;
#endif
		if (len > 0) {
			r->last_time = time(NULL);
			if (r->response) {
				nhr_response_append(r->response, buff, len);
			} else {
				r->response = nhr_response_create(buff, len);
			}
		}
	} while (len > 0);

	if (error_number != WSAEWOULDBLOCK && error_number != WSAEINPROGRESS) {
		nhr_request_close(r);
		return nhr_false;
	}
	return nhr_true;
}